

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

void __thiscall
QSQLiteDriver::QSQLiteDriver(QSQLiteDriver *this,sqlite3 *connection,QObject *parent)

{
  QSqlDriverPrivate *this_00;
  
  this_00 = (QSqlDriverPrivate *)operator_new(0xe0);
  QSqlDriverPrivate::QSqlDriverPrivate(this_00,SQLite);
  *(undefined ***)this_00 = &PTR__QSQLiteDriverPrivate_0023cd70;
  *(undefined8 *)(this_00 + 1) = 0;
  *(undefined8 *)&this_00[1].field_0x8 = 0;
  *(undefined8 *)&this_00[1].field_0x10 = 0;
  *(undefined8 *)&this_00[1].field_0x18 = 0;
  *(undefined8 *)&this_00[1].field_0x20 = 0;
  *(undefined8 *)&this_00[1].field_0x28 = 0;
  *(undefined8 *)&this_00[1].field_0x30 = 0;
  QSqlDriver::QSqlDriver((QSqlDriver *)this,(QSqlDriverPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_0023cb30;
  *(sqlite3 **)(*(long *)(this + 8) + 0xa8) = connection;
  QSqlDriver::setOpen(SUB81(this,0));
  (**(code **)(*(long *)this + 0x118))(this,0);
  return;
}

Assistant:

QSQLiteDriver::QSQLiteDriver(sqlite3 *connection, QObject *parent)
    : QSqlDriver(*new QSQLiteDriverPrivate, parent)
{
    Q_D(QSQLiteDriver);
    d->access = connection;
    setOpen(true);
    setOpenError(false);
}